

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase287::run(TestCase287 *this)

{
  Reader reader_00;
  Builder builder_00;
  word *pwVar1;
  size_t sVar2;
  size_t in_RCX;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ReaderOptions options;
  Array<capnp::word> serialized;
  TestInputStream stream;
  InputStreamMessageReader reader;
  TestMessageBuilder builder;
  Array<capnp::word> local_308;
  PointerReader local_2e8;
  StructBuilder local_2c0;
  InputStream local_298;
  word *local_290;
  word *local_288;
  undefined1 local_280;
  Reader local_278;
  SegmentReader *local_258;
  CapTableReader *pCStack_250;
  void *local_248;
  WirePointer *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  TestMessageBuilder local_100;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_100.super_MallocMessageBuilder,0,FIXED_SIZE);
  local_100.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_003788a0;
  local_100.desiredSegmentCount = 10;
  MessageBuilder::getRootInternal((Builder *)&local_2e8,(MessageBuilder *)&local_100);
  PointerBuilder::initStruct
            (&local_2c0,(PointerBuilder *)&stack0xfffffffffffffdd8,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffdc8;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffdc0;
  builder_00._builder.data = (void *)in_stack_fffffffffffffdd0;
  builder_00._builder.pointers = (WirePointer *)local_2e8.segment;
  builder_00._builder._32_8_ = local_2e8.capTable;
  initTestMessage(builder_00);
  AVar3 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_100);
  segments.ptr = (ArrayPtr<const_capnp::word> *)AVar3.size_;
  segments.size_ = in_RCX;
  messageToFlatArray(&local_308,(capnp *)AVar3.ptr,segments);
  local_298._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_00378970;
  local_290 = local_308.ptr;
  local_288 = local_308.ptr + local_308.size_;
  local_280 = 0;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  InputStreamMessageReader::InputStreamMessageReader
            ((InputStreamMessageReader *)&stack0xfffffffffffffdd8,&local_298,options,
             (ArrayPtr<capnp::word>)ZEXT816(0));
  MessageReader::getRootInternal(&local_278,(MessageReader *)&stack0xfffffffffffffdd8);
  local_2e8.pointer = local_278.reader.pointer;
  local_2e8.nestingLimit = local_278.reader.nestingLimit;
  local_2e8._28_4_ = local_278.reader._28_4_;
  local_2e8.segment = local_278.reader.segment;
  local_2e8.capTable = local_278.reader.capTable;
  PointerReader::getStruct((StructReader *)&local_258,&local_2e8,(word *)0x0);
  reader_00._reader.capTable = pCStack_250;
  reader_00._reader.segment = local_258;
  reader_00._reader.data = local_248;
  reader_00._reader.pointers = in_stack_fffffffffffffdc0;
  reader_00._reader.dataSize = (StructDataBitCount)in_stack_fffffffffffffdc8;
  reader_00._reader.pointerCount = SUB82(in_stack_fffffffffffffdc8,4);
  reader_00._reader._38_2_ = SUB82(in_stack_fffffffffffffdc8,6);
  reader_00._reader.nestingLimit = (int)in_stack_fffffffffffffdd0;
  reader_00._reader._44_4_ = SUB84(in_stack_fffffffffffffdd0,4);
  checkTestMessage(reader_00);
  InputStreamMessageReader::~InputStreamMessageReader
            ((InputStreamMessageReader *)&stack0xfffffffffffffdd8);
  kj::BufferedInputStream::~BufferedInputStream((BufferedInputStream *)&local_298);
  sVar2 = local_308.size_;
  pwVar1 = local_308.ptr;
  if (local_308.ptr != (word *)0x0) {
    local_308.ptr = (word *)0x0;
    local_308.size_ = 0;
    (*(code *)**(undefined8 **)local_308.disposer)(local_308.disposer,pwVar1,8,sVar2,sVar2,0);
  }
  TestMessageBuilder::~TestMessageBuilder(&local_100);
  return;
}

Assistant:

TEST(Orphans, ZeroOut) {
  MallocMessageBuilder builder;
  TestAllTypes::Reader orphanReader;

  {
    Orphan<TestAllTypes> orphan = builder.getOrphanage().newOrphan<TestAllTypes>();
    orphanReader = orphan.getReader();
    initTestMessage(orphan.get());
    checkTestMessage(orphan.getReader());
  }

  // Once the Orphan destructor is called, the message should be zero'd out.
  checkTestMessageAllZero(orphanReader);
}